

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O1

bool mathCore::is_DNF(expression *a)

{
  bool bVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  
  bVar1 = true;
  if ((a->FLAGS & 3U) == 0) {
    if ((a->FLAGS & 0x20U) == 0) {
      bVar1 = is_product(a);
      return bVar1;
    }
    p_Var3 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((bVar1 = (_Rb_tree_header *)p_Var3 == &(a->contents)._M_t._M_impl.super__Rb_tree_header,
           !bVar1 && (bVar2 = is_product(*(expression **)(p_Var3 + 1)), bVar2))) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
  }
  return bVar1;
}

Assistant:

bool mathCore::is_var(expression* a) {
	return a->FLAGS & F_VAR;
}